

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTextureSwizzleTests.cpp
# Opt level: O0

void __thiscall
gl3cts::TextureSwizzle::APIErrorsTest::verifyError(APIErrorsTest *this,GLenum expected_error)

{
  int iVar1;
  GLenum GVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestError *this_00;
  GLenum error;
  Functions *gl;
  GLenum expected_error_local;
  APIErrorsTest *this_local;
  
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  GVar2 = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  if (expected_error != GVar2) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Got invalid error",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
               ,0x8ec);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  return;
}

Assistant:

void APIErrorsTest::verifyError(const glw::GLenum expected_error)
{
	/*  */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	const glw::GLenum error = gl.getError();

	if (expected_error != error)
	{
		TCU_FAIL("Got invalid error");
	}
}